

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::LogRenderedText(ImVec2 *ref_pos,char *text,char *text_end)

{
  float fVar1;
  float fVar2;
  int iVar3;
  ImGuiWindow *pIVar4;
  bool bVar5;
  ImGuiContext *pIVar6;
  int iVar7;
  char *pcVar8;
  uint uVar9;
  char *str;
  char *fmt;
  
  pIVar6 = GImGui;
  pIVar4 = GImGui->CurrentWindow;
  if (text_end == (char *)0x0) {
    text_end = FindRenderedTextEnd(text,(char *)0x0);
  }
  if ((ref_pos == (ImVec2 *)0x0) ||
     (fVar1 = pIVar6->LogLinePosY, fVar2 = ref_pos->y, pIVar6->LogLinePosY = fVar2,
     fVar2 <= fVar1 + 1.0)) {
    bVar5 = false;
  }
  else {
    pIVar6->LogLineFirstItem = true;
    bVar5 = true;
  }
  iVar3 = (pIVar4->DC).TreeDepth;
  iVar7 = pIVar6->LogDepthRef;
  if (iVar3 < pIVar6->LogDepthRef) {
    pIVar6->LogDepthRef = iVar3;
    iVar7 = iVar3;
  }
  str = text;
  do {
    pcVar8 = ImStreolRange(str,text_end);
    if (str == pcVar8 && pcVar8 == text_end) {
      if (bVar5) {
        LogText("\n");
        return;
      }
    }
    else {
      uVar9 = (int)pcVar8 - (int)str;
      if ((bool)(~bVar5 & str == text)) {
        if (pIVar6->LogLineFirstItem == true) {
          fmt = "%*s%.*s";
          goto LAB_001d44d1;
        }
        LogText(" %.*s",(ulong)uVar9,str);
      }
      else {
        fmt = "\n%*s%.*s";
LAB_001d44d1:
        LogText(fmt,(ulong)(uint)((iVar3 - iVar7) * 4),"",(ulong)uVar9,str);
      }
      pIVar6->LogLineFirstItem = false;
    }
    str = pcVar8 + 1;
    if (pcVar8 == text_end) {
      return;
    }
  } while( true );
}

Assistant:

void ImGui::LogRenderedText(const ImVec2* ref_pos, const char* text, const char* text_end)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    if (!text_end)
        text_end = FindRenderedTextEnd(text, text_end);

    const bool log_new_line = ref_pos && (ref_pos->y > g.LogLinePosY + 1);
    if (ref_pos)
        g.LogLinePosY = ref_pos->y;
    if (log_new_line)
        g.LogLineFirstItem = true;

    const char* text_remaining = text;
    if (g.LogDepthRef > window->DC.TreeDepth)  // Re-adjust padding if we have popped out of our starting depth
        g.LogDepthRef = window->DC.TreeDepth;
    const int tree_depth = (window->DC.TreeDepth - g.LogDepthRef);
    for (;;)
    {
        // Split the string. Each new line (after a '\n') is followed by spacing corresponding to the current depth of our log entry.
        // We don't add a trailing \n to allow a subsequent item on the same line to be captured.
        const char* line_start = text_remaining;
        const char* line_end = ImStreolRange(line_start, text_end);
        const bool is_first_line = (line_start == text);
        const bool is_last_line = (line_end == text_end);
        if (!is_last_line || (line_start != line_end))
        {
            const int char_count = (int)(line_end - line_start);
            if (log_new_line || !is_first_line)
                LogText(IM_NEWLINE "%*s%.*s", tree_depth * 4, "", char_count, line_start);
            else if (g.LogLineFirstItem)
                LogText("%*s%.*s", tree_depth * 4, "", char_count, line_start);
            else
                LogText(" %.*s", char_count, line_start);
            g.LogLineFirstItem = false;
        }
        else if (log_new_line)
        {
            // An empty "" string at a different Y position should output a carriage return.
            LogText(IM_NEWLINE);
            break;
        }

        if (is_last_line)
            break;
        text_remaining = line_end + 1;
    }
}